

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_pagecontrol.cpp
# Opt level: O0

void QtMWidgets::PageControl::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  code *pcVar1;
  int *piVar2;
  int iVar3;
  QColor *pQVar4;
  void *_v_1;
  PageControl *_t_2;
  void *_v;
  PageControl *_t_1;
  int *result;
  PageControl *_t;
  void **_a_local;
  int _id_local;
  Call _c_local;
  QObject *_o_local;
  
  if (_c == InvokeMetaMethod) {
    if (_id == 0) {
      currentChanged((PageControl *)_o,*_a[1],*_a[2]);
    }
    else if (_id == 1) {
      setCurrentIndex((PageControl *)_o,*_a[1]);
    }
    else if (_id == 2) {
      setCount((PageControl *)_o,*_a[1]);
    }
  }
  else if (_c == IndexOfMethod) {
    pcVar1 = *_a[1];
    if (pcVar1 == currentChanged && (pcVar1 == (code *)0x0 || *(long *)((long)_a[1] + 8) == 0)) {
      *(undefined4 *)*_a = 0;
    }
  }
  else if (_c == ReadProperty) {
    piVar2 = (int *)*_a;
    switch(_id) {
    case 0:
      iVar3 = currentIndex((PageControl *)_o);
      *piVar2 = iVar3;
      break;
    case 1:
      iVar3 = count((PageControl *)_o);
      *piVar2 = iVar3;
      break;
    case 2:
      pQVar4 = pageIndicatorColor((PageControl *)_o);
      *(undefined8 *)piVar2 = *(undefined8 *)pQVar4;
      piVar2[2] = *(int *)((long)&pQVar4->ct + 4);
      *(ushort *)(piVar2 + 3) = (pQVar4->ct).argb.pad;
      break;
    case 3:
      pQVar4 = currentPageIndicatorColor((PageControl *)_o);
      *(undefined8 *)piVar2 = *(undefined8 *)pQVar4;
      piVar2[2] = *(int *)((long)&pQVar4->ct + 4);
      *(ushort *)(piVar2 + 3) = (pQVar4->ct).argb.pad;
    }
  }
  else if (_c == WriteProperty) {
    pQVar4 = (QColor *)*_a;
    switch(_id) {
    case 0:
      setCurrentIndex((PageControl *)_o,pQVar4->cspec);
      break;
    case 1:
      setCount((PageControl *)_o,pQVar4->cspec);
      break;
    case 2:
      setPageIndicatorColor((PageControl *)_o,pQVar4);
      break;
    case 3:
      setCurrentPageIndicatorColor((PageControl *)_o,pQVar4);
    }
  }
  return;
}

Assistant:

void QtMWidgets::PageControl::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<PageControl *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->currentChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 1: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 2: _t->setCount((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (PageControl::*)(int , int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&PageControl::currentChanged)) {
                *result = 0;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<PageControl *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< int*>(_v) = _t->currentIndex(); break;
        case 1: *reinterpret_cast< int*>(_v) = _t->count(); break;
        case 2: *reinterpret_cast< QColor*>(_v) = _t->pageIndicatorColor(); break;
        case 3: *reinterpret_cast< QColor*>(_v) = _t->currentPageIndicatorColor(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<PageControl *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setCurrentIndex(*reinterpret_cast< int*>(_v)); break;
        case 1: _t->setCount(*reinterpret_cast< int*>(_v)); break;
        case 2: _t->setPageIndicatorColor(*reinterpret_cast< QColor*>(_v)); break;
        case 3: _t->setCurrentPageIndicatorColor(*reinterpret_cast< QColor*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}